

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util_lite.cc
# Opt level: O0

void google::protobuf::TestUtilLite::ExpectPackedExtensionsSet(TestPackedExtensionsLite *message)

{
  bool bVar1;
  ConstType_conflict5 CVar2;
  char *pcVar3;
  char *in_R9;
  AssertHelper local_738;
  Message local_730;
  ConstType local_728;
  ForeignEnumLite local_724;
  undefined1 local_720 [8];
  AssertionResult gtest_ar_40;
  AssertHelper local_6f0;
  Message local_6e8;
  bool local_6d9;
  undefined1 local_6d8 [8];
  AssertionResult gtest_ar_;
  Message local_6c0;
  ConstType_conflict4 local_6b8;
  int local_6ac;
  undefined1 local_6a8 [8];
  AssertionResult gtest_ar_39;
  Message local_690;
  ConstType_conflict3 local_688;
  int local_684;
  undefined1 local_680 [8];
  AssertionResult gtest_ar_38;
  Message local_668;
  ConstType_conflict local_660;
  int local_654;
  undefined1 local_650 [8];
  AssertionResult gtest_ar_37;
  Message local_638;
  ConstType local_630;
  int local_62c;
  undefined1 local_628 [8];
  AssertionResult gtest_ar_36;
  Message local_610;
  ConstType_conflict2 local_608;
  int local_5fc;
  undefined1 local_5f8 [8];
  AssertionResult gtest_ar_35;
  Message local_5e0;
  ConstType_conflict1 local_5d8 [2];
  undefined1 local_5d0 [8];
  AssertionResult gtest_ar_34;
  Message local_5b8;
  ConstType_conflict local_5b0;
  int local_5a4;
  undefined1 local_5a0 [8];
  AssertionResult gtest_ar_33;
  Message local_588;
  ConstType local_580;
  int local_57c;
  undefined1 local_578 [8];
  AssertionResult gtest_ar_32;
  Message local_560;
  ConstType_conflict2 local_558;
  int local_54c;
  undefined1 local_548 [8];
  AssertionResult gtest_ar_31;
  Message local_530;
  ConstType_conflict1 local_528 [2];
  undefined1 local_520 [8];
  AssertionResult gtest_ar_30;
  Message local_508;
  ConstType_conflict local_500;
  int local_4f4;
  undefined1 local_4f0 [8];
  AssertionResult gtest_ar_29;
  Message local_4d8;
  ConstType local_4d0;
  int local_4cc;
  undefined1 local_4c8 [8];
  AssertionResult gtest_ar_28;
  Message local_4b0;
  ConstType local_4a8;
  ForeignEnumLite local_4a4;
  undefined1 local_4a0 [8];
  AssertionResult gtest_ar_27;
  Message local_488;
  bool local_47a;
  bool local_479;
  undefined1 local_478 [8];
  AssertionResult gtest_ar_26;
  Message local_460;
  ConstType_conflict4 local_458;
  int local_44c;
  undefined1 local_448 [8];
  AssertionResult gtest_ar_25;
  Message local_430;
  ConstType_conflict3 local_428;
  int local_424;
  undefined1 local_420 [8];
  AssertionResult gtest_ar_24;
  Message local_408;
  ConstType_conflict local_400;
  int local_3f4;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar_23;
  Message local_3d8;
  ConstType local_3d0;
  int local_3cc;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar_22;
  Message local_3b0;
  ConstType_conflict2 local_3a8;
  int local_39c;
  undefined1 local_398 [8];
  AssertionResult gtest_ar_21;
  Message local_380;
  ConstType_conflict1 local_378 [2];
  undefined1 local_370 [8];
  AssertionResult gtest_ar_20;
  Message local_358;
  ConstType_conflict local_350;
  int local_344;
  undefined1 local_340 [8];
  AssertionResult gtest_ar_19;
  Message local_328;
  ConstType local_320;
  int local_31c;
  undefined1 local_318 [8];
  AssertionResult gtest_ar_18;
  Message local_300;
  ConstType_conflict2 local_2f8;
  int local_2ec;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_17;
  Message local_2d0;
  ConstType_conflict1 local_2c8 [2];
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_16;
  Message local_2a8;
  ConstType_conflict local_2a0;
  int local_294;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_15;
  Message local_278;
  ConstType local_270;
  int local_26c;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_14;
  Message local_250;
  int local_248 [2];
  undefined1 local_240 [8];
  AssertionResult gtest_ar_13;
  Message local_228;
  int local_220 [2];
  undefined1 local_218 [8];
  AssertionResult gtest_ar_12;
  Message local_200;
  int local_1f8 [2];
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_11;
  Message local_1d8;
  int local_1d0 [2];
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_10;
  Message local_1b0;
  int local_1a8 [2];
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_9;
  Message local_188;
  int local_180 [2];
  undefined1 local_178 [8];
  AssertionResult gtest_ar_8;
  Message local_160;
  int local_158 [2];
  undefined1 local_150 [8];
  AssertionResult gtest_ar_7;
  Message local_138;
  int local_130 [2];
  undefined1 local_128 [8];
  AssertionResult gtest_ar_6;
  Message local_110;
  int local_108 [2];
  undefined1 local_100 [8];
  AssertionResult gtest_ar_5;
  Message local_e8;
  int local_e0 [2];
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_4;
  Message local_c0;
  int local_b8 [2];
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_3;
  Message local_98;
  int local_90 [2];
  undefined1 local_88 [8];
  AssertionResult gtest_ar_2;
  Message local_70;
  int local_68 [2];
  undefined1 local_60 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_48;
  Message local_40 [3];
  int local_28 [2];
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  TestPackedExtensionsLite *message_local;
  
  local_28[1] = 2;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )message;
  local_28[0] = proto2_unittest::TestPackedExtensionsLite::
                ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,(unsigned_char)5,true,google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>>
                          (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_true>
                                    *)&proto2_unittest::packed_int32_extension_lite);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_20,"2","message.ExtensionSize(unittest::packed_int32_extension_lite)"
             ,local_28 + 1,local_28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_40);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0x703,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::Message::~Message(local_40);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_68[1] = 2;
    local_68[0] = proto2_unittest::TestPackedExtensionsLite::
                  ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,(unsigned_char)3,true,google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>>
                            ((TestPackedExtensionsLite *)
                             gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl,
                             (ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x03_,_true>
                              *)proto2_unittest::packed_int64_extension_lite);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_60,"2",
               "message.ExtensionSize(unittest::packed_int64_extension_lite)",local_68 + 1,local_68)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
    if (!bVar1) {
      testing::Message::Message(&local_70);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                 ,0x704,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_70);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_70);
    }
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
    if (gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      local_90[1] = 2;
      local_90[0] = proto2_unittest::TestPackedExtensionsLite::
                    ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,(unsigned_char)13,true,google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>>
                              ((TestPackedExtensionsLite *)
                               gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl,
                               (ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__r_,_true>
                                *)&proto2_unittest::packed_uint32_extension_lite);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_88,"2",
                 "message.ExtensionSize(unittest::packed_uint32_extension_lite)",local_90 + 1,
                 local_90);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
      if (!bVar1) {
        testing::Message::Message(&local_98);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                   ,0x705,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_98);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_98);
      }
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
      if (gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        local_b8[1] = 2;
        local_b8[0] = proto2_unittest::TestPackedExtensionsLite::
                      ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,(unsigned_char)4,true,google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>>
                                ((TestPackedExtensionsLite *)
                                 gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl,
                                 (ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x04_,_true>
                                  *)proto2_unittest::packed_uint64_extension_lite);
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_b0,"2",
                   "message.ExtensionSize(unittest::packed_uint64_extension_lite)",local_b8 + 1,
                   local_b8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
        if (!bVar1) {
          testing::Message::Message(&local_c0);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                     ,0x706,pcVar3);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_c0)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_c0);
        }
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
        if (gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          local_e0[1] = 2;
          local_e0[0] = proto2_unittest::TestPackedExtensionsLite::
                        ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,(unsigned_char)17,true,google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>>
                                  ((TestPackedExtensionsLite *)
                                   gtest_ar.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl,
                                   (ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x11_,_true>
                                    *)&proto2_unittest::packed_sint32_extension_lite);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_d8,"2",
                     "message.ExtensionSize(unittest::packed_sint32_extension_lite)",local_e0 + 1,
                     local_e0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
          if (!bVar1) {
            testing::Message::Message(&local_e8);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                       ,0x707,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,&local_e8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_e8);
          }
          gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
          if (gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            local_108[1] = 2;
            local_108[0] = proto2_unittest::TestPackedExtensionsLite::
                           ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,(unsigned_char)18,true,google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>>
                                     ((TestPackedExtensionsLite *)
                                      gtest_ar.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl,
                                      (ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x12_,_true>
                                       *)proto2_unittest::packed_sint64_extension_lite);
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((EqHelper *)local_100,"2",
                       "message.ExtensionSize(unittest::packed_sint64_extension_lite)",local_108 + 1
                       ,local_108);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
            if (!bVar1) {
              testing::Message::Message(&local_110);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_6.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                         ,0x708,pcVar3);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_6.message_,&local_110);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
              testing::Message::~Message(&local_110);
            }
            gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
            if (gtest_ar_1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              local_130[1] = 2;
              local_130[0] = proto2_unittest::TestPackedExtensionsLite::
                             ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,(unsigned_char)7,true,google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>>
                                       ((TestPackedExtensionsLite *)
                                        gtest_ar.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl,
                                        (ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__a_,_true>
                                         *)&proto2_unittest::packed_fixed32_extension_lite);
              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                        ((EqHelper *)local_128,"2",
                         "message.ExtensionSize(unittest::packed_fixed32_extension_lite)",
                         local_130 + 1,local_130);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
              if (!bVar1) {
                testing::Message::Message(&local_138);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_7.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                           ,0x709,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_7.message_,&local_138);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_)
                ;
                testing::Message::~Message(&local_138);
              }
              gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._5_3_ = 0;
              gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
              if (gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ == 0) {
                local_158[1] = 2;
                local_158[0] = proto2_unittest::TestPackedExtensionsLite::
                               ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,(unsigned_char)6,true,google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>>
                                         ((TestPackedExtensionsLite *)
                                          gtest_ar.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl,
                                          (ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x06_,_true>
                                           *)proto2_unittest::packed_fixed64_extension_lite);
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((EqHelper *)local_150,"2",
                           "message.ExtensionSize(unittest::packed_fixed64_extension_lite)",
                           local_158 + 1,local_158);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_150);
                if (!bVar1) {
                  testing::Message::Message(&local_160);
                  pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_8.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                             ,0x70a,pcVar3);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_8.message_,&local_160);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_8.message_);
                  testing::Message::~Message(&local_160);
                }
                gtest_ar_1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._5_3_ = 0;
                gtest_ar_1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
                if (gtest_ar_1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_ == 0) {
                  local_180[1] = 2;
                  local_180[0] = proto2_unittest::TestPackedExtensionsLite::
                                 ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,(unsigned_char)15,true,google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>>
                                           ((TestPackedExtensionsLite *)
                                            gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl,
                                            (ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x0f_,_true>
                                             *)&proto2_unittest::packed_sfixed32_extension_lite);
                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                            ((EqHelper *)local_178,"2",
                             "message.ExtensionSize(unittest::packed_sfixed32_extension_lite)",
                             local_180 + 1,local_180);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_178);
                  if (!bVar1) {
                    testing::Message::Message(&local_188);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_178)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_9.message_,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                               ,0x70b,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_9.message_,&local_188);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_9.message_);
                    testing::Message::~Message(&local_188);
                  }
                  gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._5_3_ = 0;
                  gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_1_ = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
                  if (gtest_ar_1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_4_ == 0) {
                    local_1a8[1] = 2;
                    local_1a8[0] = proto2_unittest::TestPackedExtensionsLite::
                                   ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,(unsigned_char)16,true,google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>>
                                             ((TestPackedExtensionsLite *)
                                              gtest_ar.message_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl,
                                              (ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x10_,_true>
                                               *)proto2_unittest::packed_sfixed64_extension_lite);
                    testing::internal::EqHelper::Compare<int,_int,_nullptr>
                              ((EqHelper *)local_1a0,"2",
                               "message.ExtensionSize(unittest::packed_sfixed64_extension_lite)",
                               local_1a8 + 1,local_1a8);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_1a0);
                    if (!bVar1) {
                      testing::Message::Message(&local_1b0);
                      pcVar3 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_1a0);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_10.message_,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                 ,0x70c,pcVar3);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_10.message_,&local_1b0);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar_10.message_);
                      testing::Message::~Message(&local_1b0);
                    }
                    gtest_ar_1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._5_3_ = 0;
                    gtest_ar_1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_1_ = !bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
                    if (gtest_ar_1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_4_ == 0) {
                      local_1d0[1] = 2;
                      local_1d0[0] = proto2_unittest::TestPackedExtensionsLite::
                                     ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<float>,(unsigned_char)2,true,google::protobuf::internal::RepeatedPrimitiveTypeTraits<float>>
                                               ((TestPackedExtensionsLite *)
                                                gtest_ar.message_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                ._M_head_impl,
                                                (ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<float>,_(unsigned_char)__x02_,_true>
                                                 *)&proto2_unittest::packed_float_extension_lite);
                      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                ((EqHelper *)local_1c8,"2",
                                 "message.ExtensionSize(unittest::packed_float_extension_lite)",
                                 local_1d0 + 1,local_1d0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_1c8);
                      if (!bVar1) {
                        testing::Message::Message(&local_1d8);
                        pcVar3 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_1c8);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar_11.message_,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                   ,0x70d,pcVar3);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar_11.message_,&local_1d8);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)&gtest_ar_11.message_);
                        testing::Message::~Message(&local_1d8);
                      }
                      gtest_ar_1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._5_3_ = 0;
                      gtest_ar_1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_1_ = !bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
                      if (gtest_ar_1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_4_ == 0) {
                        local_1f8[1] = 2;
                        local_1f8[0] = proto2_unittest::TestPackedExtensionsLite::
                                       ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<double>,(unsigned_char)1,true,google::protobuf::internal::RepeatedPrimitiveTypeTraits<double>>
                                                 ((TestPackedExtensionsLite *)
                                                  gtest_ar.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<double>,_(unsigned_char)__x01_,_true>
                                                  *)proto2_unittest::packed_double_extension_lite);
                        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                  ((EqHelper *)local_1f0,"2",
                                   "message.ExtensionSize(unittest::packed_double_extension_lite)",
                                   local_1f8 + 1,local_1f8);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_1f0);
                        if (!bVar1) {
                          testing::Message::Message(&local_200);
                          pcVar3 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_1f0);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar_12.message_,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                     ,0x70e,pcVar3);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar_12.message_,&local_200);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&gtest_ar_12.message_);
                          testing::Message::~Message(&local_200);
                        }
                        gtest_ar_1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._5_3_ = 0;
                        gtest_ar_1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_1_ = !bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
                        if (gtest_ar_1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_4_ == 0) {
                          local_220[1] = 2;
                          local_220[0] = proto2_unittest::TestPackedExtensionsLite::
                                         ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<bool>,(unsigned_char)8,true,google::protobuf::internal::RepeatedPrimitiveTypeTraits<bool>>
                                                   ((TestPackedExtensionsLite *)
                                                    gtest_ar.message_._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<bool>,_(unsigned_char)__b_,_true>
                                                  *)&proto2_unittest::packed_bool_extension_lite);
                          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                    ((EqHelper *)local_218,"2",
                                     "message.ExtensionSize(unittest::packed_bool_extension_lite)",
                                     local_220 + 1,local_220);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_218);
                          if (!bVar1) {
                            testing::Message::Message(&local_228);
                            pcVar3 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_218);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar_13.message_,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                       ,0x70f,pcVar3);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar_13.message_,&local_228);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar_13.message_);
                            testing::Message::~Message(&local_228);
                          }
                          gtest_ar_1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._5_3_ = 0;
                          gtest_ar_1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_1_ = !bVar1;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
                          if (gtest_ar_1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_4_ == 0) {
                            local_248[1] = 2;
                            local_248[0] = proto2_unittest::TestPackedExtensionsLite::
                                           ExtensionSize<google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest::ForeignEnumLite>,(unsigned_char)14,true,google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest::ForeignEnumLite>>
                                                     ((TestPackedExtensionsLite *)
                                                      gtest_ar.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest::ForeignEnumLite>,_(unsigned_char)__x0e_,_true>
                                                  *)&proto2_unittest::packed_enum_extension_lite);
                            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                      ((EqHelper *)local_240,"2",
                                       "message.ExtensionSize(unittest::packed_enum_extension_lite)"
                                       ,local_248 + 1,local_248);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_240);
                            if (!bVar1) {
                              testing::Message::Message(&local_250);
                              pcVar3 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)local_240);
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&gtest_ar_14.message_,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                         ,0x710,pcVar3);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&gtest_ar_14.message_,&local_250);
                              testing::internal::AssertHelper::~AssertHelper
                                        ((AssertHelper *)&gtest_ar_14.message_);
                              testing::Message::~Message(&local_250);
                            }
                            gtest_ar_1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._5_3_ = 0;
                            gtest_ar_1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_1_ = !bVar1;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_240)
                            ;
                            if (gtest_ar_1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_ == 0) {
                              local_26c = 0x259;
                              local_270 = proto2_unittest::TestPackedExtensionsLite::
                                          GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_true,_0>
                                                    ((TestPackedExtensionsLite *)
                                                     gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_true>
                                                  *)&proto2_unittest::packed_int32_extension_lite,0)
                              ;
                              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                        ((EqHelper *)local_268,"601",
                                         "message.GetExtension(unittest::packed_int32_extension_lite, 0)"
                                         ,&local_26c,&local_270);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_268);
                              if (!bVar1) {
                                testing::Message::Message(&local_278);
                                pcVar3 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_268);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x713,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_15.message_,&local_278);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_15.message_);
                                testing::Message::~Message(&local_278);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_268);
                              local_294 = 0x25a;
                              local_2a0 = proto2_unittest::TestPackedExtensionsLite::
                                          GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x03_,_true,_0>
                                                    ((TestPackedExtensionsLite *)
                                                     gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x03_,_true>
                                                  *)proto2_unittest::packed_int64_extension_lite,0);
                              testing::internal::EqHelper::Compare<int,_long,_nullptr>
                                        ((EqHelper *)local_290,"602",
                                         "message.GetExtension(unittest::packed_int64_extension_lite, 0)"
                                         ,&local_294,&local_2a0);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_290);
                              if (!bVar1) {
                                testing::Message::Message(&local_2a8);
                                pcVar3 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_290);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x715,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_16.message_,&local_2a8);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_16.message_);
                                testing::Message::~Message(&local_2a8);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_290);
                              local_2c8[1] = 0x25b;
                              local_2c8[0] = proto2_unittest::TestPackedExtensionsLite::
                                             GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__r_,_true,_0>
                                                       ((TestPackedExtensionsLite *)
                                                        gtest_ar.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__r_,_true>
                                                  *)&proto2_unittest::packed_uint32_extension_lite,0
                                                  );
                              testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
                                        ((EqHelper *)local_2c0,"603",
                                         "message.GetExtension(unittest::packed_uint32_extension_lite, 0)"
                                         ,(int *)(local_2c8 + 1),local_2c8);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_2c0);
                              if (!bVar1) {
                                testing::Message::Message(&local_2d0);
                                pcVar3 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_2c0);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x717,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_17.message_,&local_2d0);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_17.message_);
                                testing::Message::~Message(&local_2d0);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_2c0);
                              local_2ec = 0x25c;
                              local_2f8 = proto2_unittest::TestPackedExtensionsLite::
                                          GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x04_,_true,_0>
                                                    ((TestPackedExtensionsLite *)
                                                     gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x04_,_true>
                                                  *)proto2_unittest::packed_uint64_extension_lite,0)
                              ;
                              testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
                                        ((EqHelper *)local_2e8,"604",
                                         "message.GetExtension(unittest::packed_uint64_extension_lite, 0)"
                                         ,&local_2ec,&local_2f8);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_2e8);
                              if (!bVar1) {
                                testing::Message::Message(&local_300);
                                pcVar3 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_2e8);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x719,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_18.message_,&local_300);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_18.message_);
                                testing::Message::~Message(&local_300);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_2e8);
                              local_31c = 0x25d;
                              local_320 = proto2_unittest::TestPackedExtensionsLite::
                                          GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x11_,_true,_0>
                                                    ((TestPackedExtensionsLite *)
                                                     gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x11_,_true>
                                                  *)&proto2_unittest::packed_sint32_extension_lite,0
                                                  );
                              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                        ((EqHelper *)local_318,"605",
                                         "message.GetExtension(unittest::packed_sint32_extension_lite, 0)"
                                         ,&local_31c,&local_320);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_318);
                              if (!bVar1) {
                                testing::Message::Message(&local_328);
                                pcVar3 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_318);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x71b,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_19.message_,&local_328);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_19.message_);
                                testing::Message::~Message(&local_328);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_318);
                              local_344 = 0x25e;
                              local_350 = proto2_unittest::TestPackedExtensionsLite::
                                          GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x12_,_true,_0>
                                                    ((TestPackedExtensionsLite *)
                                                     gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x12_,_true>
                                                  *)proto2_unittest::packed_sint64_extension_lite,0)
                              ;
                              testing::internal::EqHelper::Compare<int,_long,_nullptr>
                                        ((EqHelper *)local_340,"606",
                                         "message.GetExtension(unittest::packed_sint64_extension_lite, 0)"
                                         ,&local_344,&local_350);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_340);
                              if (!bVar1) {
                                testing::Message::Message(&local_358);
                                pcVar3 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_340);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x71d,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_20.message_,&local_358);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_20.message_);
                                testing::Message::~Message(&local_358);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_340);
                              local_378[1] = 0x25f;
                              local_378[0] = proto2_unittest::TestPackedExtensionsLite::
                                             GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__a_,_true,_0>
                                                       ((TestPackedExtensionsLite *)
                                                        gtest_ar.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__a_,_true>
                                                  *)&proto2_unittest::packed_fixed32_extension_lite,
                                                  0);
                              testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
                                        ((EqHelper *)local_370,"607",
                                         "message.GetExtension(unittest::packed_fixed32_extension_lite, 0)"
                                         ,(int *)(local_378 + 1),local_378);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_370);
                              if (!bVar1) {
                                testing::Message::Message(&local_380);
                                pcVar3 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_370);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x71f,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_21.message_,&local_380);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_21.message_);
                                testing::Message::~Message(&local_380);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_370);
                              local_39c = 0x260;
                              local_3a8 = proto2_unittest::TestPackedExtensionsLite::
                                          GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x06_,_true,_0>
                                                    ((TestPackedExtensionsLite *)
                                                     gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x06_,_true>
                                                  *)proto2_unittest::packed_fixed64_extension_lite,0
                                                  );
                              testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
                                        ((EqHelper *)local_398,"608",
                                         "message.GetExtension(unittest::packed_fixed64_extension_lite, 0)"
                                         ,&local_39c,&local_3a8);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_398);
                              if (!bVar1) {
                                testing::Message::Message(&local_3b0);
                                pcVar3 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_398);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x721,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_22.message_,&local_3b0);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_22.message_);
                                testing::Message::~Message(&local_3b0);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_398);
                              local_3cc = 0x261;
                              local_3d0 = proto2_unittest::TestPackedExtensionsLite::
                                          GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x0f_,_true,_0>
                                                    ((TestPackedExtensionsLite *)
                                                     gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x0f_,_true>
                                                  *)&proto2_unittest::packed_sfixed32_extension_lite
                                                  ,0);
                              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                        ((EqHelper *)local_3c8,"609",
                                         "message.GetExtension(unittest::packed_sfixed32_extension_lite, 0)"
                                         ,&local_3cc,&local_3d0);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_3c8);
                              if (!bVar1) {
                                testing::Message::Message(&local_3d8);
                                pcVar3 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_3c8);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x723,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_23.message_,&local_3d8);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_23.message_);
                                testing::Message::~Message(&local_3d8);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_3c8);
                              local_3f4 = 0x262;
                              local_400 = proto2_unittest::TestPackedExtensionsLite::
                                          GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x10_,_true,_0>
                                                    ((TestPackedExtensionsLite *)
                                                     gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x10_,_true>
                                                  *)proto2_unittest::packed_sfixed64_extension_lite,
                                                  0);
                              testing::internal::EqHelper::Compare<int,_long,_nullptr>
                                        ((EqHelper *)local_3f0,"610",
                                         "message.GetExtension(unittest::packed_sfixed64_extension_lite, 0)"
                                         ,&local_3f4,&local_400);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_3f0);
                              if (!bVar1) {
                                testing::Message::Message(&local_408);
                                pcVar3 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_3f0);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x725,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_24.message_,&local_408);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_24.message_);
                                testing::Message::~Message(&local_408);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_3f0);
                              local_424 = 0x263;
                              local_428 = proto2_unittest::TestPackedExtensionsLite::
                                          GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<float>,_(unsigned_char)__x02_,_true,_0>
                                                    ((TestPackedExtensionsLite *)
                                                     gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<float>,_(unsigned_char)__x02_,_true>
                                                  *)&proto2_unittest::packed_float_extension_lite,0)
                              ;
                              testing::internal::EqHelper::Compare<int,_float,_nullptr>
                                        ((EqHelper *)local_420,"611",
                                         "message.GetExtension(unittest::packed_float_extension_lite, 0)"
                                         ,&local_424,&local_428);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_420);
                              if (!bVar1) {
                                testing::Message::Message(&local_430);
                                pcVar3 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_420);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x727,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_25.message_,&local_430);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_25.message_);
                                testing::Message::~Message(&local_430);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_420);
                              local_44c = 0x264;
                              local_458 = proto2_unittest::TestPackedExtensionsLite::
                                          GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<double>,_(unsigned_char)__x01_,_true,_0>
                                                    ((TestPackedExtensionsLite *)
                                                     gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<double>,_(unsigned_char)__x01_,_true>
                                                  *)proto2_unittest::packed_double_extension_lite,0)
                              ;
                              testing::internal::EqHelper::Compare<int,_double,_nullptr>
                                        ((EqHelper *)local_448,"612",
                                         "message.GetExtension(unittest::packed_double_extension_lite, 0)"
                                         ,&local_44c,&local_458);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_448);
                              if (!bVar1) {
                                testing::Message::Message(&local_460);
                                pcVar3 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_448);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x729,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_26.message_,&local_460);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_26.message_);
                                testing::Message::~Message(&local_460);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_448);
                              local_479 = true;
                              local_47a = proto2_unittest::TestPackedExtensionsLite::
                                          GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<bool>,_(unsigned_char)__b_,_true,_0>
                                                    ((TestPackedExtensionsLite *)
                                                     gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<bool>,_(unsigned_char)__b_,_true>
                                                  *)&proto2_unittest::packed_bool_extension_lite,0);
                              testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                                        ((EqHelper *)local_478,"true",
                                         "message.GetExtension(unittest::packed_bool_extension_lite, 0)"
                                         ,&local_479,&local_47a);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_478);
                              if (!bVar1) {
                                testing::Message::Message(&local_488);
                                pcVar3 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_478);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x72b,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_27.message_,&local_488);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_27.message_);
                                testing::Message::~Message(&local_488);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_478);
                              local_4a4 = FOREIGN_LITE_BAR;
                              local_4a8 = proto2_unittest::TestPackedExtensionsLite::
                                          GetExtension<google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest::ForeignEnumLite>,_(unsigned_char)__x0e_,_true,_0>
                                                    ((TestPackedExtensionsLite *)
                                                     gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest::ForeignEnumLite>,_(unsigned_char)__x0e_,_true>
                                                  *)&proto2_unittest::packed_enum_extension_lite,0);
                              testing::internal::EqHelper::
                              Compare<proto2_unittest::ForeignEnumLite,_proto2_unittest::ForeignEnumLite,_nullptr>
                                        ((EqHelper *)local_4a0,"unittest::FOREIGN_LITE_BAR",
                                         "message.GetExtension(unittest::packed_enum_extension_lite, 0)"
                                         ,&local_4a4,&local_4a8);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_4a0);
                              if (!bVar1) {
                                testing::Message::Message(&local_4b0);
                                pcVar3 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_4a0);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_28.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x72d,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_28.message_,&local_4b0);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_28.message_);
                                testing::Message::~Message(&local_4b0);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_4a0);
                              local_4cc = 0x2bd;
                              local_4d0 = proto2_unittest::TestPackedExtensionsLite::
                                          GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_true,_0>
                                                    ((TestPackedExtensionsLite *)
                                                     gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_true>
                                                  *)&proto2_unittest::packed_int32_extension_lite,1)
                              ;
                              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                        ((EqHelper *)local_4c8,"701",
                                         "message.GetExtension(unittest::packed_int32_extension_lite, 1)"
                                         ,&local_4cc,&local_4d0);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_4c8);
                              if (!bVar1) {
                                testing::Message::Message(&local_4d8);
                                pcVar3 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_4c8);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x72f,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_29.message_,&local_4d8);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_29.message_);
                                testing::Message::~Message(&local_4d8);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_4c8);
                              local_4f4 = 0x2be;
                              local_500 = proto2_unittest::TestPackedExtensionsLite::
                                          GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x03_,_true,_0>
                                                    ((TestPackedExtensionsLite *)
                                                     gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x03_,_true>
                                                  *)proto2_unittest::packed_int64_extension_lite,1);
                              testing::internal::EqHelper::Compare<int,_long,_nullptr>
                                        ((EqHelper *)local_4f0,"702",
                                         "message.GetExtension(unittest::packed_int64_extension_lite, 1)"
                                         ,&local_4f4,&local_500);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_4f0);
                              if (!bVar1) {
                                testing::Message::Message(&local_508);
                                pcVar3 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_4f0);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_30.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x731,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_30.message_,&local_508);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_30.message_);
                                testing::Message::~Message(&local_508);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_4f0);
                              local_528[1] = 0x2bf;
                              local_528[0] = proto2_unittest::TestPackedExtensionsLite::
                                             GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__r_,_true,_0>
                                                       ((TestPackedExtensionsLite *)
                                                        gtest_ar.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__r_,_true>
                                                  *)&proto2_unittest::packed_uint32_extension_lite,1
                                                  );
                              testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
                                        ((EqHelper *)local_520,"703",
                                         "message.GetExtension(unittest::packed_uint32_extension_lite, 1)"
                                         ,(int *)(local_528 + 1),local_528);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_520);
                              if (!bVar1) {
                                testing::Message::Message(&local_530);
                                pcVar3 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_520);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_31.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x733,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_31.message_,&local_530);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_31.message_);
                                testing::Message::~Message(&local_530);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_520);
                              local_54c = 0x2c0;
                              local_558 = proto2_unittest::TestPackedExtensionsLite::
                                          GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x04_,_true,_0>
                                                    ((TestPackedExtensionsLite *)
                                                     gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x04_,_true>
                                                  *)proto2_unittest::packed_uint64_extension_lite,1)
                              ;
                              testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
                                        ((EqHelper *)local_548,"704",
                                         "message.GetExtension(unittest::packed_uint64_extension_lite, 1)"
                                         ,&local_54c,&local_558);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_548);
                              if (!bVar1) {
                                testing::Message::Message(&local_560);
                                pcVar3 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_548);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_32.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x735,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_32.message_,&local_560);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_32.message_);
                                testing::Message::~Message(&local_560);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_548);
                              local_57c = 0x2c1;
                              local_580 = proto2_unittest::TestPackedExtensionsLite::
                                          GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x11_,_true,_0>
                                                    ((TestPackedExtensionsLite *)
                                                     gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x11_,_true>
                                                  *)&proto2_unittest::packed_sint32_extension_lite,1
                                                  );
                              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                        ((EqHelper *)local_578,"705",
                                         "message.GetExtension(unittest::packed_sint32_extension_lite, 1)"
                                         ,&local_57c,&local_580);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_578);
                              if (!bVar1) {
                                testing::Message::Message(&local_588);
                                pcVar3 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_578);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_33.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x737,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_33.message_,&local_588);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_33.message_);
                                testing::Message::~Message(&local_588);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_578);
                              local_5a4 = 0x2c2;
                              local_5b0 = proto2_unittest::TestPackedExtensionsLite::
                                          GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x12_,_true,_0>
                                                    ((TestPackedExtensionsLite *)
                                                     gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x12_,_true>
                                                  *)proto2_unittest::packed_sint64_extension_lite,1)
                              ;
                              testing::internal::EqHelper::Compare<int,_long,_nullptr>
                                        ((EqHelper *)local_5a0,"706",
                                         "message.GetExtension(unittest::packed_sint64_extension_lite, 1)"
                                         ,&local_5a4,&local_5b0);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_5a0);
                              if (!bVar1) {
                                testing::Message::Message(&local_5b8);
                                pcVar3 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_5a0);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_34.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x739,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_34.message_,&local_5b8);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_34.message_);
                                testing::Message::~Message(&local_5b8);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_5a0);
                              local_5d8[1] = 0x2c3;
                              local_5d8[0] = proto2_unittest::TestPackedExtensionsLite::
                                             GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__a_,_true,_0>
                                                       ((TestPackedExtensionsLite *)
                                                        gtest_ar.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__a_,_true>
                                                  *)&proto2_unittest::packed_fixed32_extension_lite,
                                                  1);
                              testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
                                        ((EqHelper *)local_5d0,"707",
                                         "message.GetExtension(unittest::packed_fixed32_extension_lite, 1)"
                                         ,(int *)(local_5d8 + 1),local_5d8);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_5d0);
                              if (!bVar1) {
                                testing::Message::Message(&local_5e0);
                                pcVar3 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_5d0);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_35.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x73b,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_35.message_,&local_5e0);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_35.message_);
                                testing::Message::~Message(&local_5e0);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_5d0);
                              local_5fc = 0x2c4;
                              local_608 = proto2_unittest::TestPackedExtensionsLite::
                                          GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x06_,_true,_0>
                                                    ((TestPackedExtensionsLite *)
                                                     gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x06_,_true>
                                                  *)proto2_unittest::packed_fixed64_extension_lite,1
                                                  );
                              testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
                                        ((EqHelper *)local_5f8,"708",
                                         "message.GetExtension(unittest::packed_fixed64_extension_lite, 1)"
                                         ,&local_5fc,&local_608);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_5f8);
                              if (!bVar1) {
                                testing::Message::Message(&local_610);
                                pcVar3 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_5f8);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_36.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x73d,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_36.message_,&local_610);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_36.message_);
                                testing::Message::~Message(&local_610);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_5f8);
                              local_62c = 0x2c5;
                              local_630 = proto2_unittest::TestPackedExtensionsLite::
                                          GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x0f_,_true,_0>
                                                    ((TestPackedExtensionsLite *)
                                                     gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x0f_,_true>
                                                  *)&proto2_unittest::packed_sfixed32_extension_lite
                                                  ,1);
                              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                        ((EqHelper *)local_628,"709",
                                         "message.GetExtension(unittest::packed_sfixed32_extension_lite, 1)"
                                         ,&local_62c,&local_630);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_628);
                              if (!bVar1) {
                                testing::Message::Message(&local_638);
                                pcVar3 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_628);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_37.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x73f,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_37.message_,&local_638);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_37.message_);
                                testing::Message::~Message(&local_638);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_628);
                              local_654 = 0x2c6;
                              local_660 = proto2_unittest::TestPackedExtensionsLite::
                                          GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x10_,_true,_0>
                                                    ((TestPackedExtensionsLite *)
                                                     gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x10_,_true>
                                                  *)proto2_unittest::packed_sfixed64_extension_lite,
                                                  1);
                              testing::internal::EqHelper::Compare<int,_long,_nullptr>
                                        ((EqHelper *)local_650,"710",
                                         "message.GetExtension(unittest::packed_sfixed64_extension_lite, 1)"
                                         ,&local_654,&local_660);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_650);
                              if (!bVar1) {
                                testing::Message::Message(&local_668);
                                pcVar3 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_650);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_38.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x741,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_38.message_,&local_668);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_38.message_);
                                testing::Message::~Message(&local_668);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_650);
                              local_684 = 0x2c7;
                              local_688 = proto2_unittest::TestPackedExtensionsLite::
                                          GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<float>,_(unsigned_char)__x02_,_true,_0>
                                                    ((TestPackedExtensionsLite *)
                                                     gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<float>,_(unsigned_char)__x02_,_true>
                                                  *)&proto2_unittest::packed_float_extension_lite,1)
                              ;
                              testing::internal::EqHelper::Compare<int,_float,_nullptr>
                                        ((EqHelper *)local_680,"711",
                                         "message.GetExtension(unittest::packed_float_extension_lite, 1)"
                                         ,&local_684,&local_688);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_680);
                              if (!bVar1) {
                                testing::Message::Message(&local_690);
                                pcVar3 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_680);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_39.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x743,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_39.message_,&local_690);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_39.message_);
                                testing::Message::~Message(&local_690);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_680);
                              local_6ac = 0x2c8;
                              local_6b8 = proto2_unittest::TestPackedExtensionsLite::
                                          GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<double>,_(unsigned_char)__x01_,_true,_0>
                                                    ((TestPackedExtensionsLite *)
                                                     gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<double>,_(unsigned_char)__x01_,_true>
                                                  *)proto2_unittest::packed_double_extension_lite,1)
                              ;
                              testing::internal::EqHelper::Compare<int,_double,_nullptr>
                                        ((EqHelper *)local_6a8,"712",
                                         "message.GetExtension(unittest::packed_double_extension_lite, 1)"
                                         ,&local_6ac,&local_6b8);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_6a8);
                              if (!bVar1) {
                                testing::Message::Message(&local_6c0);
                                pcVar3 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_6a8);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x745,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_.message_,&local_6c0);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_.message_);
                                testing::Message::~Message(&local_6c0);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_6a8);
                              CVar2 = proto2_unittest::TestPackedExtensionsLite::
                                      GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<bool>,_(unsigned_char)__b_,_true,_0>
                                                ((TestPackedExtensionsLite *)
                                                 gtest_ar.message_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl,
                                                 (ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<bool>,_(unsigned_char)__b_,_true>
                                                  *)&proto2_unittest::packed_bool_extension_lite,1);
                              local_6d9 = !CVar2;
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_6d8,&local_6d9,(type *)0x0);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_6d8);
                              if (!bVar1) {
                                testing::Message::Message(&local_6e8);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar_40.message_,(internal *)local_6d8,
                                           (AssertionResult *)
                                           "message.GetExtension(unittest::packed_bool_extension_lite, 1)"
                                           ,"true","false",in_R9);
                                pcVar3 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_6f0,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x746,pcVar3);
                                testing::internal::AssertHelper::operator=(&local_6f0,&local_6e8);
                                testing::internal::AssertHelper::~AssertHelper(&local_6f0);
                                std::__cxx11::string::~string((string *)&gtest_ar_40.message_);
                                testing::Message::~Message(&local_6e8);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_6d8);
                              local_724 = FOREIGN_LITE_BAZ;
                              local_728 = proto2_unittest::TestPackedExtensionsLite::
                                          GetExtension<google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest::ForeignEnumLite>,_(unsigned_char)__x0e_,_true,_0>
                                                    ((TestPackedExtensionsLite *)
                                                     gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest::ForeignEnumLite>,_(unsigned_char)__x0e_,_true>
                                                  *)&proto2_unittest::packed_enum_extension_lite,1);
                              testing::internal::EqHelper::
                              Compare<proto2_unittest::ForeignEnumLite,_proto2_unittest::ForeignEnumLite,_nullptr>
                                        ((EqHelper *)local_720,"unittest::FOREIGN_LITE_BAZ",
                                         "message.GetExtension(unittest::packed_enum_extension_lite, 1)"
                                         ,&local_724,&local_728);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_720);
                              if (!bVar1) {
                                testing::Message::Message(&local_730);
                                pcVar3 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_720);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_738,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x748,pcVar3);
                                testing::internal::AssertHelper::operator=(&local_738,&local_730);
                                testing::internal::AssertHelper::~AssertHelper(&local_738);
                                testing::Message::~Message(&local_730);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_720);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void TestUtilLite::ExpectPackedExtensionsSet(
    const unittest::TestPackedExtensionsLite& message) {
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_int32_extension_lite));
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_int64_extension_lite));
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_uint32_extension_lite));
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_uint64_extension_lite));
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_sint32_extension_lite));
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_sint64_extension_lite));
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_fixed32_extension_lite));
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_fixed64_extension_lite));
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_sfixed32_extension_lite));
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_sfixed64_extension_lite));
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_float_extension_lite));
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_double_extension_lite));
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_bool_extension_lite));
  ASSERT_EQ(2, message.ExtensionSize(unittest::packed_enum_extension_lite));

  EXPECT_EQ(601,
            message.GetExtension(unittest::packed_int32_extension_lite, 0));
  EXPECT_EQ(602,
            message.GetExtension(unittest::packed_int64_extension_lite, 0));
  EXPECT_EQ(603,
            message.GetExtension(unittest::packed_uint32_extension_lite, 0));
  EXPECT_EQ(604,
            message.GetExtension(unittest::packed_uint64_extension_lite, 0));
  EXPECT_EQ(605,
            message.GetExtension(unittest::packed_sint32_extension_lite, 0));
  EXPECT_EQ(606,
            message.GetExtension(unittest::packed_sint64_extension_lite, 0));
  EXPECT_EQ(607,
            message.GetExtension(unittest::packed_fixed32_extension_lite, 0));
  EXPECT_EQ(608,
            message.GetExtension(unittest::packed_fixed64_extension_lite, 0));
  EXPECT_EQ(609,
            message.GetExtension(unittest::packed_sfixed32_extension_lite, 0));
  EXPECT_EQ(610,
            message.GetExtension(unittest::packed_sfixed64_extension_lite, 0));
  EXPECT_EQ(611,
            message.GetExtension(unittest::packed_float_extension_lite, 0));
  EXPECT_EQ(612,
            message.GetExtension(unittest::packed_double_extension_lite, 0));
  EXPECT_EQ(true,
            message.GetExtension(unittest::packed_bool_extension_lite, 0));
  EXPECT_EQ(unittest::FOREIGN_LITE_BAR,
            message.GetExtension(unittest::packed_enum_extension_lite, 0));
  EXPECT_EQ(701,
            message.GetExtension(unittest::packed_int32_extension_lite, 1));
  EXPECT_EQ(702,
            message.GetExtension(unittest::packed_int64_extension_lite, 1));
  EXPECT_EQ(703,
            message.GetExtension(unittest::packed_uint32_extension_lite, 1));
  EXPECT_EQ(704,
            message.GetExtension(unittest::packed_uint64_extension_lite, 1));
  EXPECT_EQ(705,
            message.GetExtension(unittest::packed_sint32_extension_lite, 1));
  EXPECT_EQ(706,
            message.GetExtension(unittest::packed_sint64_extension_lite, 1));
  EXPECT_EQ(707,
            message.GetExtension(unittest::packed_fixed32_extension_lite, 1));
  EXPECT_EQ(708,
            message.GetExtension(unittest::packed_fixed64_extension_lite, 1));
  EXPECT_EQ(709,
            message.GetExtension(unittest::packed_sfixed32_extension_lite, 1));
  EXPECT_EQ(710,
            message.GetExtension(unittest::packed_sfixed64_extension_lite, 1));
  EXPECT_EQ(711,
            message.GetExtension(unittest::packed_float_extension_lite, 1));
  EXPECT_EQ(712,
            message.GetExtension(unittest::packed_double_extension_lite, 1));
  EXPECT_FALSE(message.GetExtension(unittest::packed_bool_extension_lite, 1));
  EXPECT_EQ(unittest::FOREIGN_LITE_BAZ,
            message.GetExtension(unittest::packed_enum_extension_lite, 1));
}